

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_scalar_functions.hpp
# Opt level: O2

void sum_overload_function(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int argc_local;
  int local_cc;
  SourceLineInfo local_c8;
  BinaryExpr<const_int_&,_const_int_&> local_b8;
  AssertionHandler catchAssertionHandler;
  StringRef local_40;
  
  local_b8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1703dc;
  local_b8.super_ITransientExpression.m_isBinaryExpression = true;
  local_b8.super_ITransientExpression.m_result = false;
  local_b8.super_ITransientExpression._10_6_ = 0;
  local_c8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/tools/sqlite3_api_wrapper/test/include/udf_scalar_functions.hpp"
  ;
  local_c8.line = 199;
  argc_local = argc;
  Catch::StringRef::StringRef(&local_40,"argc > 0");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_b8,&local_c8,local_40,Normal);
  local_cc = 0;
  local_c8.file = (char *)&argc_local;
  Catch::ExprLhs<int_const&>::operator>(&local_b8,(ExprLhs<int_const&> *)&local_c8,&local_cc);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_b8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_b8.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  iVar1 = duckdb_shell_sqlite3_value_int(*argv);
  if (argc_local == 3) {
    iVar2 = duckdb_shell_sqlite3_value_int(argv[1]);
    iVar3 = duckdb_shell_sqlite3_value_int(argv[2]);
  }
  else {
    iVar3 = 0;
    if (argc_local == 2) {
      iVar2 = duckdb_shell_sqlite3_value_int(argv[1]);
    }
    else {
      iVar2 = 0;
    }
  }
  duckdb_shell_sqlite3_result_int(context,iVar2 + iVar3 + iVar1);
  return;
}

Assistant:

static void sum_overload_function(sqlite3_context *context, int argc, sqlite3_value **argv) {
	REQUIRE(argc > 0);
	int value1, value2, value3;
	value2 = 0;
	value3 = 0;
	value1 = sqlite3_value_int(argv[0]);
	if (argc == 2) {
		value2 = sqlite3_value_int(argv[1]);
	} else if (argc == 3) {
		value2 = sqlite3_value_int(argv[1]);
		value3 = sqlite3_value_int(argv[2]);
	}

	sqlite3_result_int(context, value1 + value2 + value3);
}